

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cpp
# Opt level: O0

void zmq::zmq_abort(char *errmsg_)

{
  print_backtrace();
  abort();
}

Assistant:

void zmq::zmq_abort (const char *errmsg_)
{
#if defined ZMQ_HAVE_WINDOWS

    //  Raise STATUS_FATAL_APP_EXIT.
    ULONG_PTR extra_info[1];
    extra_info[0] = (ULONG_PTR) errmsg_;
    RaiseException (0x40000015, EXCEPTION_NONCONTINUABLE, 1, extra_info);
#else
    LIBZMQ_UNUSED (errmsg_);
    print_backtrace ();
    abort ();
#endif
}